

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

void __thiscall CBlockPolicyEstimator::FlushFeeEstimates(CBlockPolicyEstimator *this)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  bool bVar2;
  FILE *data_xor;
  path *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000050;
  AutoFile est_file;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe9c;
  path *in_stack_fffffffffffffea0;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffeb8;
  FILE *file;
  AutoFile *in_stack_fffffffffffffee0;
  path *flag;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  CBlockPolicyEstimator *in_stack_ffffffffffffff10;
  ConstevalFormatString<1U> fmt;
  size_t sVar4;
  char *pcVar5;
  string_view in_stack_ffffffffffffff60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  flag = in_RDI;
  data_xor = fsbridge::fopen((char *)&(in_RDI->super_path)._M_pathname._M_string_length,"wb");
  fmt.fmt = (char *)0x0;
  sVar4 = 0;
  pcVar5 = (char *)0x0;
  file = (FILE *)&stack0xffffffffffffff48;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  AutoFile::AutoFile(in_stack_fffffffffffffee0,file,
                     (vector<std::byte,_std::allocator<std::byte>_> *)data_xor);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector(in_stack_fffffffffffffea8);
  bVar2 = AutoFile::IsNull((AutoFile *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                          );
  if ((bVar2) ||
     (bVar2 = Write(in_stack_ffffffffffffff10,
                    (AutoFile *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
     !bVar2)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    fs::PathToString_abi_cxx11_(in_stack_fffffffffffffea0);
    uVar3 = 2;
    source_file._M_str = pcVar5;
    source_file._M_len = sVar4;
    LogPrintFormatInternal<std::__cxx11::string>
              (in_stack_ffffffffffffff60,source_file,in_stack_ffffffffffffff0c,(LogFlags)flag,
               in_stack_00000040,fmt,in_stack_00000050);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe9c,uVar3));
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    fs::path::filename(in_RDI);
    fs::PathToString_abi_cxx11_(in_stack_fffffffffffffea0);
    uVar3 = 2;
    source_file_00._M_str = pcVar5;
    source_file_00._M_len = sVar4;
    LogPrintFormatInternal<std::__cxx11::string>
              (in_stack_ffffffffffffff60,source_file_00,in_stack_ffffffffffffff0c,(LogFlags)flag,
               in_stack_00000040,fmt,in_stack_00000050);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe9c,uVar3));
    fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffe9c,uVar3));
  }
  AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffe9c,uVar3));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CBlockPolicyEstimator::FlushFeeEstimates()
{
    AutoFile est_file{fsbridge::fopen(m_estimation_filepath, "wb")};
    if (est_file.IsNull() || !Write(est_file)) {
        LogPrintf("Failed to write fee estimates to %s. Continue anyway.\n", fs::PathToString(m_estimation_filepath));
    } else {
        LogPrintf("Flushed fee estimates to %s.\n", fs::PathToString(m_estimation_filepath.filename()));
    }
}